

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_signed.cpp
# Opt level: O3

sc_signed * sc_dt::operator^(sc_signed *__return_storage_ptr__,long u,sc_signed *v)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t __n;
  int s;
  sc_digit ud [3];
  
  if (u == 0) {
    sc_signed::sc_signed(__return_storage_ptr__,v);
  }
  else {
    uVar3 = -u;
    if ((ulong)u < 0x8000000000000001) {
      uVar3 = 0x8000000000000000;
    }
    if (0 < u) {
      uVar3 = u;
    }
    __n = 0xc;
    uVar2 = 0;
    do {
      uVar4 = uVar2;
      ud[uVar4] = (uint)uVar3 & 0x3fffffff;
      __n = __n - 4;
      if (1 < uVar4) break;
      bVar1 = 0x3fffffff < uVar3;
      uVar3 = uVar3 >> 0x1e;
      uVar2 = uVar4 + 1;
    } while (bVar1);
    if (uVar4 < 2) {
      memset(ud + uVar4 + 1,0,__n);
    }
    s = (uint)(0 < u) * 2 + -1;
    if (v->sgn == 0) {
      sc_signed::sc_signed(__return_storage_ptr__,s,0x40,3,ud,false);
    }
    else {
      xor_signed_friend(__return_storage_ptr__,s,0x40,3,ud,v->sgn,v->nbits,v->ndigits,v->digit);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

sc_signed
operator^(long u, const sc_signed& v)
{

  if (u == 0)
    return sc_signed(v);

  CONVERT_LONG(u);

  if (v.sgn == SC_ZERO)
    return sc_signed(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud, false);

  // other cases
  return xor_signed_friend(us, BITS_PER_ULONG, DIGITS_PER_ULONG, ud,
                           v.sgn, v.nbits, v.ndigits, v.digit);

}